

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# except.cc
# Opt level: O2

void kratos::print_ast_node(IRNode *node)

{
  uint uVar1;
  bool bVar2;
  ostream *poVar3;
  istream *piVar4;
  pointer filename;
  char *pcVar5;
  uint uVar6;
  undefined8 uVar7;
  string local_280 [8];
  ifstream file;
  string local_78 [32];
  size_type *local_58;
  string line;
  
  if (node != (IRNode *)0x0) {
    std::mutex::lock((mutex *)print_ast_mutex_);
    filename = (node->fn_name_ln).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = (node->fn_name_ln).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    if (filename != (pointer)uVar7) {
      line.field_2._8_8_ = uVar7;
      for (; filename != (pointer)uVar7; filename = filename + 1) {
        bVar2 = fs::exists(&filename->first);
        if (bVar2) {
          blue_line_abi_cxx11_();
          poVar3 = std::operator<<((ostream *)&std::cerr,local_280);
          std::endl<char,std::char_traits<char>>(poVar3);
          std::__cxx11::string::~string(local_280);
          poVar3 = std::operator<<((ostream *)&std::cerr,"\x1b[94m");
          poVar3 = std::operator<<(poVar3,(string *)filename);
          poVar3 = std::operator<<(poVar3,":");
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          poVar3 = std::operator<<(poVar3,"\x1b[0m");
          std::endl<char,std::char_traits<char>>(poVar3);
          local_58 = &line._M_string_length;
          line._M_dataplus._M_p = (pointer)0x0;
          line._M_string_length._0_1_ = 0;
          std::ifstream::ifstream(local_280,(string *)filename,_S_in);
          uVar6 = 1;
          while( true ) {
            piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)local_280,(string *)&local_58);
            if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
            uVar1 = filename->second;
            if (uVar6 == uVar1) {
              poVar3 = std::operator<<((ostream *)&std::cerr,"\x1b[91m");
              pcVar5 = ">";
LAB_001b24fe:
              poVar3 = std::operator<<(poVar3,pcVar5);
              poVar3 = std::operator<<(poVar3,(string *)&local_58);
              poVar3 = std::operator<<(poVar3,"\x1b[0m");
              std::endl<char,std::char_traits<char>>(poVar3);
            }
            else if (uVar6 <= uVar1 + 2 && uVar1 - 2 <= uVar6) {
              poVar3 = std::operator<<((ostream *)&std::cerr,"\x1b[92m");
              pcVar5 = " ";
              goto LAB_001b24fe;
            }
            uVar6 = uVar6 + 1;
          }
          blue_line_abi_cxx11_();
          poVar3 = std::operator<<((ostream *)&std::cerr,local_78);
          uVar7 = line.field_2._8_8_;
          std::endl<char,std::char_traits<char>>(poVar3);
          std::__cxx11::string::~string(local_78);
          std::ifstream::~ifstream(local_280);
          std::__cxx11::string::~string((string *)&local_58);
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)print_ast_mutex_);
  }
  return;
}

Assistant:

void print_ast_node(const IRNode* node) {
    if (!node) {
        return;
    }
    print_ast_mutex_.lock();
    if (!node->fn_name_ln.empty()) {
        // print out a blue line
        for (auto const& [filename, line_number] : node->fn_name_ln) {
            if (fs::exists(filename)) {
                std::cerr << blue_line() << std::endl;
                std::cerr << BLUE << filename << ":" << line_number << ENDC << std::endl;
                uint32_t line_count = 0;
                std::string line;
                std::ifstream file(filename);
                while (std::getline(file, line)) {
                    line_count++;
                    if (line_count == line_number) {
                        std::cerr << RED << ">" << line << ENDC << std::endl;
                    } else if (line_count >= line_number - CODE_RANGE &&
                               line_count <= line_number + CODE_RANGE) {
                        std::cerr << GREEN << " " << line << ENDC << std::endl;
                    }
                }
                std::cerr << blue_line() << std::endl;
            }
        }
    }
    print_ast_mutex_.unlock();
}